

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ScatterLayerParams::MergePartialFromCodedStream
          (ScatterLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong uVar5;
  bool bVar6;
  uint32 uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong unaff_R13;
  pair<unsigned_long,_bool> pVar11;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013a0b1;
      input->buffer_ = pbVar3 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013a0b1:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    uVar7 = (uint32)uVar10;
    iVar9 = 6;
    if ((uVar10 & 0x100000000) == 0) {
LAB_0013a123:
      if ((uVar7 & 7) == 4 || uVar7 == 0) {
        iVar9 = 7;
      }
      else {
        bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
        if (bVar6) goto LAB_0013a14a;
      }
    }
    else {
      uVar8 = (uint)(uVar10 >> 3) & 0x1fffffff;
      if (uVar8 != 2) {
        if ((uVar8 != 1) || ((char)uVar10 != '\b')) goto LAB_0013a123;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar11._8_8_ = 1;
          pVar11.first = (long)(char)uVar2;
        }
        else {
          pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->axis_ = pVar11.first;
          goto LAB_0013a14a;
        }
        goto LAB_0013a14c;
      }
      if ((char)uVar10 != '\x10') goto LAB_0013a123;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar10 = (ulong)bVar1;
        uVar7 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0013a170;
        input->buffer_ = pbVar3 + 1;
        bVar6 = true;
      }
      else {
        uVar7 = 0;
LAB_0013a170:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        bVar6 = -1 < (long)uVar10;
      }
      uVar5 = unaff_R13;
      if (bVar6) {
        uVar5 = uVar10;
      }
      unaff_R13 = uVar5 & 0xffffffff;
      if (bVar6) {
        this->mode_ = (int)uVar5;
LAB_0013a14a:
        iVar9 = 0;
      }
    }
LAB_0013a14c:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool ScatterLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ScatterLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ScatterMode mode = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_mode(static_cast< ::CoreML::Specification::ScatterMode >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ScatterLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ScatterLayerParams)
  return false;
#undef DO_
}